

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O1

shared_ptr<duckdb::CSVRejectsTable,_true> __thiscall
duckdb::CSVRejectsTable::GetOrCreate
          (CSVRejectsTable *this,ClientContext *context,string *rejects_scan,string *rejects_error)

{
  ulong *puVar1;
  size_t __n;
  CSVRejectsTable *this_00;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  ObjectCache *key_00;
  Catalog *this_01;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar5;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar6;
  ostream *poVar7;
  BinderException *pBVar8;
  size_type *psVar9;
  ulong *puVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar12;
  undefined8 uVar13;
  bool bVar14;
  shared_ptr<duckdb::CSVRejectsTable,_true> sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  ostringstream error;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  CSVRejectsTable *local_1f0;
  string local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [376];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  __n = rejects_scan->_M_string_length;
  if ((__n == rejects_error->_M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((rejects_scan->_M_dataplus)._M_p,(rejects_error->_M_dataplus)._M_p,__n),
      iVar2 == 0)))) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "The names of the rejects scan and rejects error tables can\'t be the same. Use different names for these tables."
               ,"");
    BinderException::BinderException(pBVar8,(string *)local_1a8);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  StringUtil::Upper((string *)local_1c8,rejects_scan);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x13b4c03);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230.field_2._8_8_ = plVar3[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_230._M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1f0 = this;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_230);
  puVar1 = (ulong *)(local_1a8 + 0x10);
  puVar10 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar10) {
    local_1a8._16_8_ = *puVar10;
    local_1a8._24_8_ = plVar3[3];
    local_1a8._0_8_ = puVar1;
  }
  else {
    local_1a8._16_8_ = *puVar10;
    local_1a8._0_8_ = (ulong *)*plVar3;
  }
  local_1a8._8_8_ = plVar3[1];
  *plVar3 = (long)puVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  StringUtil::Upper(&local_1e8,rejects_error);
  uVar12 = 0xf;
  if ((ulong *)local_1a8._0_8_ != puVar1) {
    uVar12 = local_1a8._16_8_;
  }
  if (uVar12 < local_1e8._M_string_length + local_1a8._8_8_) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar13 = local_1e8.field_2._M_allocated_capacity;
    }
    if (local_1e8._M_string_length + local_1a8._8_8_ <= (ulong)uVar13) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,local_1a8._0_8_);
      goto LAB_00bf715c;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append(local_1a8,(ulong)local_1e8._M_dataplus._M_p);
LAB_00bf715c:
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar9 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_210.field_2._M_allocated_capacity = *psVar9;
    local_210.field_2._8_8_ = puVar4[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar9;
    local_210._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_210._M_string_length = puVar4[1];
  *puVar4 = psVar9;
  puVar4[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((ulong *)local_1a8._0_8_ != puVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_);
  }
  key_00 = ObjectCache::GetObjectCache(context);
  local_1a8._0_8_ = puVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"temp","");
  this_01 = Catalog::GetCatalog(context,(string *)local_1a8);
  if ((ulong *)local_1a8._0_8_ != puVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_8_ = puVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"main","");
  oVar5 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_01,context,(string *)local_1a8,rejects_scan,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  if ((ulong *)local_1a8._0_8_ != puVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_8_ = puVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"main","");
  oVar6 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_01,context,(string *)local_1a8,rejects_error,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  if ((ulong *)local_1a8._0_8_ != puVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (oVar5.ptr == (TableCatalogEntry *)0x0 && oVar6.ptr == (TableCatalogEntry *)0x0) {
    bVar14 = false;
    this_00 = local_1f0;
  }
  else {
    ObjectCache::Get<duckdb::CSVRejectsTable>((ObjectCache *)local_1c8,(string *)key_00);
    this_00 = local_1f0;
    bVar14 = (pointer)local_1c8._0_8_ == (pointer)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
  }
  if (bVar14) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if (oVar5.ptr != (TableCatalogEntry *)0x0) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Reject Scan Table name \"",0x18);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(rejects_scan->_M_dataplus)._M_p,
                          rejects_scan->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is already in use. ",0x15);
    }
    if (oVar6.ptr != (TableCatalogEntry *)0x0) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Reject Error Table name \"",0x19);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(rejects_error->_M_dataplus)._M_p,
                          rejects_error->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is already in use. ",0x15);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Either drop the used name(s), or give other name options in the CSV Reader function.\n"
               ,0x55);
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    BinderException::BinderException(pBVar8,&local_230);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  sVar15 = ObjectCache::
           GetOrCreate<duckdb::CSVRejectsTable,std::__cxx11::string_const&,std::__cxx11::string_const&>
                     ((ObjectCache *)this_00,(string *)key_00,&local_210,rejects_scan);
  _Var11._M_pi = sVar15.internal.
                 super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
    _Var11._M_pi = extraout_RDX;
  }
  sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  return (shared_ptr<duckdb::CSVRejectsTable,_true>)
         sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVRejectsTable> CSVRejectsTable::GetOrCreate(ClientContext &context, const string &rejects_scan,
                                                         const string &rejects_error) {
	// Check that these names can't be the same
	if (rejects_scan == rejects_error) {
		throw BinderException("The names of the rejects scan and rejects error tables can't be the same. Use different "
		                      "names for these tables.");
	}
	auto key =
	    "CSV_REJECTS_TABLE_CACHE_ENTRY_" + StringUtil::Upper(rejects_scan) + "_" + StringUtil::Upper(rejects_error);
	auto &cache = ObjectCache::GetObjectCache(context);
	auto &catalog = Catalog::GetCatalog(context, TEMP_CATALOG);
	auto rejects_scan_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_scan,
	                                                              OnEntryNotFound::RETURN_NULL) != nullptr;
	auto rejects_error_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_error,
	                                                               OnEntryNotFound::RETURN_NULL) != nullptr;
	if ((rejects_scan_exist || rejects_error_exist) && !cache.Get<CSVRejectsTable>(key)) {
		std::ostringstream error;
		if (rejects_scan_exist) {
			error << "Reject Scan Table name \"" << rejects_scan << "\" is already in use. ";
		}
		if (rejects_error_exist) {
			error << "Reject Error Table name \"" << rejects_error << "\" is already in use. ";
		}
		error << "Either drop the used name(s), or give other name options in the CSV Reader function.\n";
		throw BinderException(error.str());
	}

	return cache.GetOrCreate<CSVRejectsTable>(key, rejects_scan, rejects_error);
}